

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.h
# Opt level: O2

void __thiscall
FloatingPointType::FloatingPointType(FloatingPointType *this,string *name,TypeKind kind)

{
  (this->super_Type).kind = kind;
  (this->super_Type).isConst = false;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__FloatingPointType_00198968;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  return;
}

Assistant:

Type(TypeKind kind): kind(kind) {}